

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testInvalid_Classifier_PredictedFeatureNameWrongType(void)

{
  Rep *pRVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ostream *poVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  void **ppvVar10;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  Model spec;
  FeatureDescription feature;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  _Vector_base<long,_std::allocator<long>_> local_118;
  TensorAttributes tensorAttributesIn;
  Result res;
  string labels [4];
  
  CoreML::Specification::Model::Model(&spec);
  CoreML::Result::Result(&res);
  tensorAttributesIn.name = "InTensor";
  tensorAttributesIn.dimension = 3;
  tensorAttributesIn._12_4_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)labels,"1",(allocator<char> *)&feature);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(labels + 1),"2",(allocator<char> *)&classLabels);
  std::__cxx11::string::string<std::allocator<char>>((string *)(labels + 2),"3",&local_1a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)(labels + 3),"4",&local_1aa);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&classLabels,
             labels,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stack0xffffffffffffffc8,(allocator_type *)&feature);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_130,&classLabels);
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buildBasicNeuralNetworkClassifierModel
            (&spec,true,&tensorAttributesIn,&local_130,
             (vector<long,_std::allocator<long>_> *)&local_118,true);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_130);
  spec.specificationversion_ = 4;
  pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(pMVar3->traininginput_).super_RepeatedPtrFieldBase);
  pMVar3 = spec.description_;
  if (spec.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  pRVar1 = (pMVar3->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  iVar7 = (pMVar3->input_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar8 = 0; (long)iVar7 * 8 != lVar8; lVar8 = lVar8 + 8) {
    CoreML::Specification::FeatureDescription::FeatureDescription
              (&feature,*(FeatureDescription **)((long)ppvVar10 + lVar8));
    pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
    pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                       (&pMVar3->traininginput_);
    CoreML::Specification::FeatureDescription::CopyFrom(pFVar4,&feature);
    CoreML::Specification::FeatureDescription::~FeatureDescription(&feature);
  }
  pMVar3 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->traininginput_);
  if (spec.description_ == (ModelDescription *)0x0) {
    spec.description_ =
         (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  CoreML::Specification::FeatureDescription::set_name
            (pFVar4,((spec.description_)->predictedfeaturename_).ptr_);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  CoreML::Specification::FeatureType::mutable_int64type(pFVar5);
  CoreML::Model::validate((Result *)&feature,&spec);
  CoreML::Result::operator=(&res,(Result *)&feature);
  std::__cxx11::string::~string((string *)&feature._internal_metadata_);
  bVar2 = CoreML::Result::good(&res);
  if (bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x93a);
    poVar6 = std::operator<<(poVar6,": error: ");
    pcVar9 = "!((res).good())";
  }
  else {
    pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
    CoreML::Specification::FeatureType::clear_int64type(pFVar5);
    pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
    CoreML::Specification::FeatureType::mutable_stringtype(pFVar5);
    CoreML::Model::validate((Result *)&feature,&spec);
    CoreML::Result::operator=(&res,(Result *)&feature);
    std::__cxx11::string::~string((string *)&feature._internal_metadata_);
    bVar2 = CoreML::Result::good(&res);
    iVar7 = 0;
    if (bVar2) goto LAB_0016fcc0;
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x941);
    poVar6 = std::operator<<(poVar6,": error: ");
    pcVar9 = "(res).good()";
  }
  poVar6 = std::operator<<(poVar6,pcVar9);
  poVar6 = std::operator<<(poVar6," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar6);
  iVar7 = 1;
LAB_0016fcc0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&classLabels);
  lVar8 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&labels[0]._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&spec);
  return iVar7;
}

Assistant:

int testInvalid_Classifier_PredictedFeatureNameWrongType() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    // Re-adding model inputs and the target + predicted feature nmae to classifier's training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput2->set_name(spec.description().predictedfeaturename());
    trainingInput2->mutable_type()->mutable_int64type(); // buildBasicNeuralNetworkClassifierModel adds the predictedFeatureName's output as a String type, this should fail validation

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);


    // Correct type of target in training inputs
    trainingInput2->mutable_type()->clear_int64type();
    trainingInput2->mutable_type()->mutable_stringtype();
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}